

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigPart.c
# Opt level: O2

Vec_Ptr_t * Aig_ManSupportsRegisters(Aig_Man_t *p)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Vec_Ptr_t *p_00;
  Vec_Ptr_t *p_01;
  Vec_Int_t *p_02;
  void *pvVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  int iVar8;
  int i;
  
  p_00 = Aig_ManSupports(p);
  p_01 = Vec_PtrStart(p->nRegs);
  iVar1 = p_00->nSize;
  iVar8 = 0;
  if (iVar1 < 1) {
    iVar1 = 0;
  }
  do {
    if (iVar8 == iVar1) {
      Vec_PtrFree(p_00);
      iVar1 = p_01->nSize;
      iVar8 = 0;
      if (iVar1 < 1) {
        iVar1 = 0;
      }
      do {
        if (iVar1 == iVar8) {
          return p_01;
        }
        pvVar4 = Vec_PtrEntry(p_01,iVar8);
        iVar8 = iVar8 + 1;
      } while (pvVar4 != (void *)0x0);
      __assert_fail("vSupp != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigPart.c"
                    ,0x1c7,"Vec_Ptr_t *Aig_ManSupportsRegisters(Aig_Man_t *)");
    }
    p_02 = (Vec_Int_t *)Vec_PtrEntry(p_00,iVar8);
    iVar2 = Vec_IntPop(p_02);
    iVar2 = (p->nRegs - p->nObjs[3]) + iVar2;
    if (iVar2 < 0) {
      Vec_IntFree(p_02);
    }
    else {
      i = 0;
      uVar6 = 0;
      while( true ) {
        iVar5 = (int)uVar6;
        if (p_02->nSize <= i) break;
        iVar3 = Vec_IntEntry(p_02,i);
        iVar3 = (p->nRegs - p->nObjs[2]) + iVar3;
        uVar7 = uVar6;
        if (-1 < iVar3) {
          if (p->nRegs <= iVar3) {
            __assert_fail("iIn < Aig_ManRegNum(p)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigPart.c"
                          ,0x1bc,"Vec_Ptr_t *Aig_ManSupportsRegisters(Aig_Man_t *)");
          }
          if ((iVar5 < 0) || (p_02->nSize <= iVar5)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                          ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
          }
          uVar7 = (ulong)(iVar5 + 1);
          p_02->pArray[uVar6] = iVar3;
        }
        i = i + 1;
        uVar6 = uVar7;
      }
      if (p_02->nSize < iVar5) {
        __assert_fail("p->nSize >= nSizeNew",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x2ac,"void Vec_IntShrink(Vec_Int_t *, int)");
      }
      p_02->nSize = iVar5;
      if (p->nRegs <= iVar2) {
        __assert_fail("iOut < Aig_ManRegNum(p)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigPart.c"
                      ,0x1c1,"Vec_Ptr_t *Aig_ManSupportsRegisters(Aig_Man_t *)");
      }
      Vec_PtrWriteEntry(p_01,iVar2,p_02);
    }
    iVar8 = iVar8 + 1;
  } while( true );
}

Assistant:

Vec_Ptr_t * Aig_ManSupportsRegisters( Aig_Man_t * p )
{
    Vec_Ptr_t * vSupports, * vMatrix;
    Vec_Int_t * vSupp;
    int iOut, iIn, k, m, i;
    // get structural supports for each output
    vSupports = Aig_ManSupports( p );
    // transforms the supports into the latch dependency matrix
    vMatrix = Vec_PtrStart( Aig_ManRegNum(p) );
    Vec_PtrForEachEntry( Vec_Int_t *, vSupports, vSupp, i )
    {
        // skip true POs
        iOut = Vec_IntPop( vSupp );
        iOut -= Aig_ManCoNum(p) - Aig_ManRegNum(p);
        if ( iOut < 0 )
        {
            Vec_IntFree( vSupp );
            continue;
        }
        // remove PIs
        m = 0;
        Vec_IntForEachEntry( vSupp, iIn, k )
        {
            iIn -= Aig_ManCiNum(p) - Aig_ManRegNum(p);
            if ( iIn < 0 )
                continue;
            assert( iIn < Aig_ManRegNum(p) );
            Vec_IntWriteEntry( vSupp, m++, iIn );
        }
        Vec_IntShrink( vSupp, m );
        // store support in the matrix
        assert( iOut < Aig_ManRegNum(p) );
        Vec_PtrWriteEntry( vMatrix, iOut, vSupp );
    }
    Vec_PtrFree( vSupports );
    // check that all supports are used
    Vec_PtrForEachEntry( Vec_Int_t *, vMatrix, vSupp, i )
        assert( vSupp != NULL );
    return vMatrix;
}